

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O3

Bytes __thiscall Omega_h::mark_fan_preimage(Omega_h *this,LOs *a2b)

{
  size_type *psVar1;
  int *piVar2;
  void *pvVar3;
  ulong **__dest;
  long *plVar4;
  undefined8 *puVar5;
  long lVar6;
  ulong *puVar7;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar8;
  int iVar9;
  Alloc *pAVar10;
  ulong uVar11;
  Alloc *pAVar12;
  Bytes BVar13;
  ScopedTimer omega_h_scoped_function_timer;
  Write<signed_char> out;
  size_type __dnew;
  type f;
  ScopedTimer local_119;
  string local_118;
  Write<signed_char> local_f8;
  ulong *local_e0;
  long local_d8;
  ulong local_d0 [2];
  Alloc *local_c0;
  Write<signed_char> local_b8;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  long lStack_90;
  Alloc *local_88;
  void *pvStack_80;
  Alloc *local_78;
  void *pvStack_70;
  ulong **local_60;
  ulong *local_58;
  ulong *local_50 [2];
  Alloc *local_40;
  Alloc *local_38;
  
  pAVar12 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar12 & 1) == 0) {
    uVar11 = pAVar12->size;
    if ((int)(uVar11 >> 2) < 1) {
LAB_002fc1c9:
      fail("assertion %s failed at %s +%d\n","a2b.size() >= 1",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
           ,0x11b);
    }
  }
  else {
    if ((int)((ulong)pAVar12 >> 5) < 1) goto LAB_002fc1c9;
    uVar11 = (ulong)pAVar12 >> 3;
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
  Write<signed_char>::Write(&local_f8,(int)(uVar11 >> 2) + -1,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  pvVar8 = local_f8.shared_alloc_.direct_ptr;
  local_88 = local_f8.shared_alloc_.alloc;
  if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 && local_f8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_88 = (Alloc *)((local_f8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_f8.shared_alloc_.alloc)->use_count = (local_f8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pvStack_80 = local_f8.shared_alloc_.direct_ptr;
  local_78 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78 = (Alloc *)(local_78->size * 8 + 1);
    }
    else {
      local_78->use_count = local_78->use_count + 1;
    }
  }
  pvVar3 = (a2b->write_).shared_alloc_.direct_ptr;
  if (((ulong)local_f8.shared_alloc_.alloc & 1) == 0) {
    iVar9 = (int)(local_f8.shared_alloc_.alloc)->size;
  }
  else {
    iVar9 = (int)((ulong)local_f8.shared_alloc_.alloc >> 3);
  }
  local_60 = local_50;
  local_e0 = (ulong *)0x5d;
  local_c0 = local_78;
  pvStack_70 = pvVar3;
  local_40 = local_88;
  local_38 = (Alloc *)this;
  __dest = (ulong **)std::__cxx11::string::_M_create((ulong *)&local_60,(ulong)&local_e0);
  puVar7 = local_e0;
  local_50[0] = local_e0;
  local_60 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_58 = puVar7;
  *(undefined1 *)((long)__dest + (long)puVar7) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_60);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_98 = *puVar7;
    lStack_90 = plVar4[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar7;
    local_a8 = (ulong *)*plVar4;
  }
  local_a0 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct((ulong)&local_e0,'\x02');
  *(undefined2 *)local_e0 = 0x3438;
  uVar11 = 0xf;
  if (local_a8 != &local_98) {
    uVar11 = local_98;
  }
  if (uVar11 < (ulong)(local_d8 + local_a0)) {
    uVar11 = 0xf;
    if (local_e0 != local_d0) {
      uVar11 = local_d0[0];
    }
    if ((ulong)(local_d8 + local_a0) <= uVar11) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_a8);
      goto LAB_002fbeda;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_e0);
LAB_002fbeda:
  psVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_118.field_2._M_allocated_capacity = *psVar1;
    local_118.field_2._8_8_ = puVar5[3];
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar1;
    local_118._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_118._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  begin_code("parallel_for",local_118._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  pAVar12 = local_40;
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,(long)local_50[0] + 1);
  }
  if (0 < iVar9) {
    if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
      pAVar12->use_count = pAVar12->use_count + -1;
      pAVar12 = (Alloc *)(pAVar12->size * 8 + 1);
    }
    local_88 = (Alloc *)0x0;
    pvStack_80 = (void *)0x0;
    pAVar10 = local_c0;
    if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
      local_c0->use_count = local_c0->use_count + -1;
      pAVar10 = (Alloc *)(local_c0->size * 8 + 1);
    }
    local_78 = (Alloc *)0x0;
    pvStack_70 = (void *)0x0;
    entering_parallel = '\0';
    lVar6 = 0;
    do {
      *(bool *)((long)pvVar8 + lVar6) =
           *(int *)((long)pvVar3 + lVar6 * 4) != *(int *)((long)pvVar3 + lVar6 * 4 + 4);
      lVar6 = lVar6 + 1;
    } while (iVar9 != (int)lVar6);
    if (((ulong)pAVar10 & 7) == 0 && pAVar10 != (Alloc *)0x0) {
      piVar2 = &pAVar10->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(pAVar10);
        operator_delete(pAVar10,0x48);
      }
    }
    if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
      piVar2 = &pAVar12->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(pAVar12);
        operator_delete(pAVar12,0x48);
      }
    }
  }
  ScopedTimer::~ScopedTimer(&local_119);
  pAVar12 = local_38;
  local_b8.shared_alloc_.alloc = local_f8.shared_alloc_.alloc;
  local_b8.shared_alloc_.direct_ptr = local_f8.shared_alloc_.direct_ptr;
  if ((((ulong)local_f8.shared_alloc_.alloc & 7) == 0 &&
       local_f8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_f8.shared_alloc_.alloc)->use_count = (local_f8.shared_alloc_.alloc)->use_count + -1;
    local_b8.shared_alloc_.alloc = (Alloc *)((local_f8.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_f8.shared_alloc_.alloc = (Alloc *)0x0;
  local_f8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)local_38,&local_b8);
  pAVar10 = local_b8.shared_alloc_.alloc;
  pvVar8 = extraout_RDX;
  if (((ulong)local_b8.shared_alloc_.alloc & 7) == 0 && local_b8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_b8.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_b8.shared_alloc_.alloc);
      operator_delete(pAVar10,0x48);
      pvVar8 = extraout_RDX_00;
    }
  }
  pAVar10 = local_78;
  if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
    piVar2 = &local_78->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_78);
      operator_delete(pAVar10,0x48);
      pvVar8 = extraout_RDX_01;
    }
  }
  pAVar10 = local_88;
  if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
    piVar2 = &local_88->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_88);
      operator_delete(pAVar10,0x48);
      pvVar8 = extraout_RDX_02;
    }
  }
  pAVar10 = local_f8.shared_alloc_.alloc;
  if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 && local_f8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_f8.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_f8.shared_alloc_.alloc);
      operator_delete(pAVar10,0x48);
      pvVar8 = extraout_RDX_03;
    }
  }
  BVar13.write_.shared_alloc_.direct_ptr = pvVar8;
  BVar13.write_.shared_alloc_.alloc = pAVar12;
  return (Bytes)BVar13.write_.shared_alloc_;
}

Assistant:

Bytes mark_fan_preimage(LOs a2b) {
  OMEGA_H_CHECK(a2b.size() >= 1);
  auto out = Write<Byte>(a2b.size() - 1);
  auto f = OMEGA_H_LAMBDA(LO i) { out[i] = (a2b[i] != a2b[i + 1]); };
  parallel_for(out.size(), f);
  return out;
}